

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O2

void __thiscall Potassco::SmodelsConvert::flushExternal(SmodelsConvert *this)

{
  Atom AVar1;
  SmData *pSVar2;
  pointer puVar3;
  Atom_t *pAVar4;
  AbstractProgram *pAVar5;
  Atom *pAVar6;
  Atom_t *pAVar7;
  Atom_t at;
  Span<unsigned_int> local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48 = 0;
  uStack_40 = 0;
  pSVar2 = this->data_;
  puVar3 = (pSVar2->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pSVar2->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (pSVar2->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  pAVar4 = (pSVar2->extern_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (pAVar7 = (pSVar2->extern_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start; pSVar2 = this->data_, pAVar7 != pAVar4;
      pAVar7 = pAVar7 + 1) {
    pAVar6 = SmData::mapAtom(pSVar2,*pAVar7);
    AVar1 = *pAVar6;
    if (this->ext_ == false) {
      if (((uint)AVar1 >> 0x1c & 1) == 0) {
        at = (uint)AVar1 & 0xfffffff;
        if ((uint)AVar1 >> 0x1e == 1) {
          local_58.size = 1;
          local_58.first = &at;
          (*this->out_->_vptr_AbstractProgram[4])(this->out_,0,&local_58,&local_48);
        }
        else if ((uint)AVar1 >> 0x1e == 0) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&this->data_->head_,&at);
        }
      }
    }
    else {
      (*this->out_->_vptr_AbstractProgram[9])(this->out_,(ulong)((uint)AVar1 & 0xfffffff));
    }
  }
  if ((pSVar2->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pSVar2->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pAVar5 = this->out_;
    local_58 = toSpan<std::vector<unsigned_int,std::allocator<unsigned_int>>>(&pSVar2->head_);
    (*pAVar5->_vptr_AbstractProgram[4])(pAVar5,1,&local_58,&local_48);
  }
  return;
}

Assistant:

void SmodelsConvert::flushExternal() {
	LitSpan T = toSpan<Lit_t>();
	data_->head_.clear();
	for (SmData::AtomVec::const_iterator it = data_->extern_.begin(), end = data_->extern_.end(); it != end; ++it) {
		SmData::Atom& a = data_->mapAtom(*it);
		Value_t vt = static_cast<Value_t>(a.extn);
		if (!ext_) {
			if (a.head) { continue; }
			Atom_t at = a;
			if      (vt == Value_t::Free) { data_->head_.push_back(at); }
			else if (vt == Value_t::True) { out_.rule(Head_t::Disjunctive, toSpan(&at, 1), T); }
		}
		else {
			out_.external(a, vt);
		}
	}
	if (!data_->head_.empty()) {
		out_.rule(Head_t::Choice, toSpan(data_->head_), T);
	}
}